

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

AWeapon * __thiscall APlayerPawn::BestWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  byte bVar1;
  int iVar2;
  AInventory *pAVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  AWeapon *pAVar5;
  PClass *pPVar6;
  int iVar7;
  AAmmo *pAVar8;
  AWeapon *this_00;
  bool bVar9;
  AWeapon *local_38;
  
  pAVar3 = AActor::FindInventory
                     (&this->super_AActor,
                      (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
  this_00 = (AWeapon *)(this->super_AActor).Inventory.field_0.p;
  if ((this_00 != (AWeapon *)0x0) &&
     (((this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
       ObjectFlags & 0x20) != 0)) {
    (this->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    this_00 = (AWeapon *)0x0;
  }
  if (this_00 == (AWeapon *)0x0) {
    local_38 = (AWeapon *)0x0;
  }
  else {
    iVar7 = 0x7fffffff;
    local_38 = (AWeapon *)0x0;
    do {
      pPVar6 = AWeapon::RegistrationInfo.MyClass;
      if ((this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject
          .Class == (PClass *)0x0) {
        iVar2 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(this_00);
        (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = (PClass *)CONCAT44(extraout_var,iVar2);
      }
      pPVar4 = (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.Class;
      bVar9 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar6 && bVar9) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar9 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar6) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if ((bVar9) && (this_00->SelectionOrder <= iVar7)) {
        if (ammotype == (PClassAmmo *)0x0) {
LAB_0046895a:
          if (pAVar3 == (AInventory *)0x0) {
            bVar1 = (this_00->super_AStateProvider).super_AInventory.field_0x4fd;
joined_r0x0046898f:
            if ((bVar1 & 4) != 0) goto LAB_004688d4;
          }
          else {
            pAVar5 = (this_00->SisterWeapon).field_0.p;
            if (pAVar5 != (AWeapon *)0x0) {
              if (((pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.ObjectFlags & 0x20) == 0) {
                bVar1 = (((this_00->SisterWeapon).field_0.p)->super_AStateProvider).super_AInventory
                        .field_0x4fd;
                goto joined_r0x0046898f;
              }
              (this_00->SisterWeapon).field_0.p = (AWeapon *)0x0;
            }
          }
          if ((((this_00->super_AStateProvider).super_AInventory.field_0x4fc & 0x20) != 0) ||
             (bVar9 = AWeapon::CheckAmmo(this_00,0,false,false,-1), bVar9)) {
            if (this_00->MinSelAmmo1 < 1) {
LAB_004689fc:
              if (this_00->MinSelAmmo2 < 1) {
LAB_00468a30:
                iVar7 = this_00->SelectionOrder;
                local_38 = this_00;
              }
              else {
                pAVar8 = (this_00->Ammo2).field_0.p;
                if (pAVar8 != (AAmmo *)0x0) {
                  if (((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.
                       ObjectFlags & 0x20) == 0) {
                    if (this_00->MinSelAmmo2 <=
                        (((this_00->Ammo2).field_0.p)->super_AInventory).Amount) goto LAB_00468a30;
                  }
                  else {
                    (this_00->Ammo2).field_0.p = (AAmmo *)0x0;
                  }
                }
              }
            }
            else {
              pAVar8 = (this_00->Ammo1).field_0.p;
              if (pAVar8 != (AAmmo *)0x0) {
                if (((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.
                     ObjectFlags & 0x20) != 0) goto LAB_00468a40;
                if (this_00->MinSelAmmo1 <= (((this_00->Ammo1).field_0.p)->super_AInventory).Amount)
                goto LAB_004689fc;
              }
            }
          }
        }
        else {
          pAVar8 = (this_00->Ammo1).field_0.p;
          if (pAVar8 != (AAmmo *)0x0) {
            if (((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
                0x20) == 0) {
              pAVar8 = (this_00->Ammo1).field_0.p;
              if ((pAVar8 != (AAmmo *)0x0) &&
                 (((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags
                  & 0x20) != 0)) {
                (this_00->Ammo1).field_0.p = (AAmmo *)0x0;
                pAVar8 = (AAmmo *)0x0;
              }
              if ((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.Class ==
                  (PClass *)0x0) {
                pPVar6 = (PClass *)
                         (**(pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.
                            _vptr_DObject)(pAVar8);
                (pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar6;
              }
              if ((PClassAmmo *)
                  (pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.Class ==
                  ammotype) goto LAB_0046895a;
            }
            else {
LAB_00468a40:
              (this_00->Ammo1).field_0.p = (AAmmo *)0x0;
            }
          }
        }
      }
LAB_004688d4:
      pAVar5 = (AWeapon *)
               (this_00->super_AStateProvider).super_AInventory.super_AActor.Inventory.field_0.p;
      if ((pAVar5 != (AWeapon *)0x0) &&
         (((pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject
           .ObjectFlags & 0x20) != 0)) {
        (this_00->super_AStateProvider).super_AInventory.super_AActor.Inventory.field_0.p =
             (AInventory *)0x0;
        pAVar5 = (AWeapon *)0x0;
      }
      this_00 = pAVar5;
    } while (pAVar5 != (AWeapon *)0x0);
  }
  return local_38;
}

Assistant:

AWeapon *APlayerPawn::BestWeapon(PClassAmmo *ammotype)
{
	AWeapon *bestMatch = NULL;
	int bestOrder = INT_MAX;
	AInventory *item;
	AWeapon *weap;
	bool tomed = NULL != FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);

	// Find the best weapon the player has.
	for (item = Inventory; item != NULL; item = item->Inventory)
	{
		if (!item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			continue;

		weap = static_cast<AWeapon *> (item);

		// Don't select it if it's worse than what was already found.
		if (weap->SelectionOrder > bestOrder)
			continue;

		// Don't select it if its primary fire doesn't use the desired ammo.
		if (ammotype != NULL &&
			(weap->Ammo1 == NULL ||
			 weap->Ammo1->GetClass() != ammotype))
			continue;

		// Don't select it if the Tome is active and this isn't the powered-up version.
		if (tomed && weap->SisterWeapon != NULL && weap->SisterWeapon->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if it's powered-up and the Tome is not active.
		if (!tomed && weap->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if there isn't enough ammo to use its primary fire.
		if (!(weap->WeaponFlags & WIF_AMMO_OPTIONAL) &&
			!weap->CheckAmmo (AWeapon::PrimaryFire, false))
			continue;

		// Don't select if if there isn't enough ammo as determined by the weapon's author.
		if (weap->MinSelAmmo1 > 0 && (weap->Ammo1 == NULL || weap->Ammo1->Amount < weap->MinSelAmmo1))
			continue;
		if (weap->MinSelAmmo2 > 0 && (weap->Ammo2 == NULL || weap->Ammo2->Amount < weap->MinSelAmmo2))
			continue;

		// This weapon is usable!
		bestOrder = weap->SelectionOrder;
		bestMatch = weap;
	}
	return bestMatch;
}